

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O2

GLPipelineObj * __thiscall
Diligent::PipelineStateGLImpl::GetGLProgramPipeline
          (PipelineStateGLImpl *this,NativeGLContextType Context)

{
  GLuint GVar1;
  SHADER_TYPE ShaderType;
  GLenum GVar2;
  ulong uVar3;
  long lVar4;
  pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>
  *ctx_pipeline;
  pointer ppVar5;
  GLPipelineObj *this_00;
  GLenum err;
  string msg;
  uint local_64;
  SpinLock *local_60;
  NativeGLContextType local_58;
  string local_50;
  
  local_60 = &this->m_ProgPipelineLock;
  local_58 = Context;
  Threading::SpinLock::lock(local_60);
  ppVar5 = (this->m_GLProgPipelines).
           super__Vector_base<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppVar5 == (this->m_GLProgPipelines).
                  super__Vector_base<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      local_50._M_dataplus._M_p._0_1_ = 1;
      std::
      vector<std::pair<__GLXcontextRec*,GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>>,std::allocator<std::pair<__GLXcontextRec*,GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>>>>
      ::emplace_back<__GLXcontextRec*&,bool>
                ((vector<std::pair<__GLXcontextRec*,GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>>,std::allocator<std::pair<__GLXcontextRec*,GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>>>>
                  *)&this->m_GLProgPipelines,&local_58,(bool *)&local_50);
      ppVar5 = (this->m_GLProgPipelines).
               super__Vector_base<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      GVar1 = ppVar5[-1].second.m_uiHandle;
      this_00 = &ppVar5[-1].second;
      lVar4 = 0;
      for (uVar3 = 0; uVar3 < this->m_NumPrograms; uVar3 = uVar3 + 1) {
        ShaderType = GetShaderStageType(this,(Uint32)uVar3);
        GVar2 = ShaderTypeToGLShaderBit(ShaderType);
        (*__glewUseProgramStages)
                  (GVar1,GVar2,
                   **(GLuint **)
                     ((long)&(this->m_GLPrograms->
                             super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr + lVar4));
        local_64 = glGetError();
        if (local_64 != 0) {
          LogError<false,char[28],char[17],unsigned_int>
                    (false,"GetGLProgramPipeline",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                     ,0x287,(char (*) [28])"glUseProgramStages() failed",
                     (char (*) [17])"\nGL Error Code: ",&local_64);
          FormatString<char[6]>(&local_50,(char (*) [6])0x2b552e);
          DebugAssertionFailed
                    ((Char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                      local_50._M_dataplus._M_p._0_1_),"GetGLProgramPipeline",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                     ,0x287);
          std::__cxx11::string::~string((string *)&local_50);
        }
        lVar4 = lVar4 + 0x10;
      }
      GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>::SetName
                (this_00,(this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
                         super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                         .m_Desc.super_DeviceObjectAttribs.Name);
LAB_001707e8:
      Threading::SpinLock::unlock(local_60);
      return this_00;
    }
    if (ppVar5->first == Context) {
      this_00 = &ppVar5->second;
      goto LAB_001707e8;
    }
    ppVar5 = ppVar5 + 1;
  } while( true );
}

Assistant:

GLObjectWrappers::GLPipelineObj& PipelineStateGLImpl::GetGLProgramPipeline(GLContext::NativeGLContextType Context)
{
    Threading::SpinLockGuard Guard{m_ProgPipelineLock};
    for (auto& ctx_pipeline : m_GLProgPipelines)
    {
        if (ctx_pipeline.first == Context)
            return ctx_pipeline.second;
    }

    // Create new program pipeline
    m_GLProgPipelines.emplace_back(Context, true);
    auto&  ctx_pipeline = m_GLProgPipelines.back();
    GLuint Pipeline     = ctx_pipeline.second;
    for (Uint32 i = 0; i < GetNumShaderStages(); ++i)
    {
        auto GLShaderBit = ShaderTypeToGLShaderBit(GetShaderStageType(i));
        // If the program has an active code for each stage mentioned in set flags,
        // then that code will be used by the pipeline. If program is 0, then the given
        // stages are cleared from the pipeline.
        glUseProgramStages(Pipeline, GLShaderBit, m_GLPrograms[i]->GetGLHandle());
        DEV_CHECK_GL_ERROR("glUseProgramStages() failed");
    }

    ctx_pipeline.second.SetName(m_Desc.Name);

    return ctx_pipeline.second;
}